

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<13>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<13> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  int MT;
  TabulationRecord *pTVar1;
  PartialCrossSection *entry;
  TabulationRecord *this_00;
  StructureDivision local_70;
  
  MT = (this->super_Base).MT_;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (double)(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.
                 atomicWeightRatio_;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)((int)((ulong)((long)(this->partials_).
                                  super__Vector_base<njoy::ENDFtk::section::Type<13>::PartialCrossSection,_std::allocator<njoy::ENDFtk::section::Type<13>::PartialCrossSection>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->partials_).
                                 super__Vector_base<njoy::ENDFtk::section::Type<13>::PartialCrossSection,_std::allocator<njoy::ENDFtk::section::Type<13>::PartialCrossSection>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,it,MAT,MF,MT);
  if ((this->total_).
      super__Optional_base<njoy::ENDFtk::section::Type<13>::TotalCrossSection,_false,_false>.
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<13>::TotalCrossSection,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<13>::TotalCrossSection>._M_engaged
      == true) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TabulationRecord *)&this->total_,it,MAT,MF,MT);
  }
  pTVar1 = &((this->partials_).
             super__Vector_base<njoy::ENDFtk::section::Type<13>::PartialCrossSection,_std::allocator<njoy::ENDFtk::section::Type<13>::PartialCrossSection>_>
             ._M_impl.super__Vector_impl_data._M_finish)->super_TabulationRecord;
  for (this_00 = &((this->partials_).
                   super__Vector_base<njoy::ENDFtk::section::Type<13>::PartialCrossSection,_std::allocator<njoy::ENDFtk::section::Type<13>::PartialCrossSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord;
      this_00 != pTVar1; this_00 = this_00 + 1) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  sectionEndRecord(&local_70,MAT,MF);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_70,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(), 0, 0,
                 this->NK(), 0 ).print( it, MAT, MF, MT );
  if ( this->total_ ) { this->total_->print( it, MAT, MF, MT ); }
  for ( const auto& entry : this->partials_ ) {

    entry.print( it, MAT, MF, MT );
  }
  SEND( MAT, MF ).print( it );
}